

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint64_t get_tlb_pfn_from_entrylo(uint64_t entrylo)

{
  uint64_t uVar1;
  uint64_t entrylo_local;
  
  uVar1 = extract64(entrylo,6,0x36);
  return uVar1;
}

Assistant:

static inline uint64_t get_tlb_pfn_from_entrylo(uint64_t entrylo)
{
#if defined(TARGET_MIPS64)
    return extract64(entrylo, 6, 54);
#else
    return extract64(entrylo, 6, 24) | /* PFN */
           (extract64(entrylo, 32, 32) << 24); /* PFNX */
#endif
}